

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

Matrix * __thiscall sptk::Matrix::operator-=(Matrix *this,Matrix *matrix)

{
  double *pdVar1;
  double *pdVar2;
  logic_error *this_00;
  double *pdVar3;
  
  if ((this->num_row_ == matrix->num_row_) && (this->num_column_ == matrix->num_column_)) {
    pdVar2 = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar2 != pdVar1) {
      pdVar3 = (matrix->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        *pdVar2 = *pdVar2 - *pdVar3;
        pdVar2 = pdVar2 + 1;
        pdVar3 = pdVar3 + 1;
      } while (pdVar2 != pdVar1);
    }
    return this;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Matrix: Matrix sizes do not match");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Matrix& Matrix::operator-=(const Matrix& matrix) {
  if (num_row_ != matrix.num_row_ || num_column_ != matrix.num_column_) {
    throw std::logic_error(kErrorMessageForLogicError);
  }
  std::transform(data_.begin(), data_.end(), matrix.data_.begin(),
                 data_.begin(), std::minus<double>());
  return *this;
}